

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.hpp
# Opt level: O0

bool __thiscall tcu::Interval::isOrdinary(Interval *this)

{
  bool bVar1;
  undefined1 local_11;
  Interval *this_local;
  
  bVar1 = hasNaN(this);
  local_11 = false;
  if (!bVar1) {
    bVar1 = empty(this);
    local_11 = false;
    if (!bVar1) {
      local_11 = isFinite(this);
    }
  }
  return local_11;
}

Assistant:

bool		isOrdinary		(void) const { return !hasNaN() && !empty() && isFinite(); }